

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRemoveDefinitionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmRemoveDefinitionsCommand::Clone(cmRemoveDefinitionsCommand *this)

{
  cmCommand *this_00;
  cmRemoveDefinitionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmRemoveDefinitionsCommand((cmRemoveDefinitionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmRemoveDefinitionsCommand; }